

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  FILE *__stream;
  size_t sVar5;
  void *__ptr;
  FILE *pFVar6;
  char *local_38;
  
  pcVar3 = (char *)cmime_base64_encode_string(test_string1);
  local_38 = pcVar3;
  iVar1 = strcmp(pcVar3,test_string1_base64);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,test_string1_base64)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_base64.c"
                  ,0x2e,"int main(int, const char **)");
  }
  pcVar4 = (char *)cmime_base64_decode_string(pcVar3);
  iVar1 = strcmp(test_string1,pcVar4);
  if (iVar1 == 0) {
    free(pcVar4);
    free(pcVar3);
    asprintf(&local_38,"%s/c0001.txt","samples");
    __stream = fopen(local_38,"rb");
    iVar1 = -1;
    if (__stream != (FILE *)0x0) {
      free(local_38);
      iVar2 = fseek(__stream,0,2);
      if (iVar2 == 0) {
        sVar5 = ftell(__stream);
        rewind(__stream);
        __ptr = calloc(1,sVar5 + 0x14);
        fread(__ptr,1,sVar5,__stream);
        iVar2 = ferror(__stream);
        if (iVar2 == 0) {
          rewind(__stream);
          pFVar6 = fopen("test_base64.out","wb");
          if (pFVar6 != (FILE *)0x0) {
            cmime_base64_encode_file(__stream,pFVar6,0);
            pcVar3 = (char *)cmime_base64_encode_string(__ptr);
            sVar5 = ftell(pFVar6);
            rewind(pFVar6);
            pcVar4 = (char *)calloc(1,sVar5 + 0x14);
            pFVar6 = freopen("test_base64.out","rb",pFVar6);
            fread(pcVar4,1,sVar5,pFVar6);
            iVar2 = ferror(pFVar6);
            if (iVar2 == 0) {
              iVar1 = strcmp(pcVar3,pcVar4);
              if (iVar1 != 0) {
                __assert_fail("strcmp(in_64,out_data)==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_base64.c"
                              ,0x53,"int main(int, const char **)");
              }
              free(pcVar3);
              free(pcVar4);
              free(__ptr);
              fclose(pFVar6);
              fclose(__stream);
              iVar1 = remove("test_base64.out");
              iVar1 = -(uint)(iVar1 != 0);
            }
          }
        }
      }
    }
    return iVar1;
  }
  __assert_fail("strcmp(test_string1,s2)==0",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_base64.c"
                ,0x30,"int main(int, const char **)");
}

Assistant:

int main (int argc, char const *argv[]) {
    char *s = NULL;
    char *s2 = NULL;
    FILE *fp = NULL;
    FILE *fp2 = NULL;
    long size = 0;
    char *in_data = NULL;
    char *out_data = NULL;
    char *in_64 = NULL;
    
    s = cmime_base64_encode_string(test_string1);
    assert(strcmp(s,test_string1_base64)==0);
    s2 = cmime_base64_decode_string(s);
    assert(strcmp(test_string1,s2)==0);
    free(s2);
    free(s);
    
    asprintf(&s,"%s/c0001.txt",SAMPLES_DIR);
    if ((fp = fopen(s, "rb")) == NULL) 
        return(-1);
        
    free(s);
    
    if (fseek(fp, 0, SEEK_END)!=0)
        return(-1);
        
    size = ftell(fp);
    rewind(fp); 
    in_data = (char*) calloc(sizeof(char), size + 20);
    fread(in_data, 1, size, fp);
    if(ferror(fp))
        return(-1);

    rewind(fp);
    if ((fp2 = fopen("test_base64.out","wb")) == NULL)
        return(-1);

    cmime_base64_encode_file(fp,fp2,0);
    in_64 = cmime_base64_encode_string(in_data);
    
    size = ftell(fp2);
    rewind(fp2);
    out_data = (char *)calloc(sizeof(char),size + 20);
    fp2 = freopen("test_base64.out","rb",fp2);
    fread(out_data,1,size,fp2);
    if (ferror(fp2))
        return(-1);

    assert(strcmp(in_64,out_data)==0);
    free(in_64);
    free(out_data);
    free(in_data);
    
    fclose(fp2);
    fclose(fp);
    
    if (remove("test_base64.out")!=0)
        return(-1);
    
    return(0);
}